

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::detail::
     input_range_type_impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (string *type,Module *m)

{
  Type_Info ti;
  Module *pMVar1;
  allocator<char> local_219;
  string local_218;
  code *local_1f8;
  undefined8 local_1f0;
  Proxy_Function local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  code *local_1b0;
  undefined8 local_1a8;
  Proxy_Function local_1a0;
  allocator<char> local_189;
  string local_188;
  code *local_168;
  undefined8 local_160;
  Proxy_Function local_158;
  allocator<char> local_141;
  string local_140;
  code *local_120;
  undefined8 local_118;
  Proxy_Function local_110;
  allocator<char> local_f9;
  string local_f8;
  code *local_d8;
  undefined8 local_d0;
  Proxy_Function local_c8;
  allocator<char> local_b1;
  string local_b0;
  Proxy_Function local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  user_type<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ();
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local,
                 "_Range");
  ti.m_bare_type_info = (type_info *)uStack_28;
  ti.m_type_info = (type_info *)local_30;
  ti._16_8_ = local_20;
  Module::add(m,ti,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local,
                 "_Range");
  copy_constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (&local_80,local_18);
  std::__cxx11::string::~string((string *)&local_80);
  pMVar1 = local_18;
  constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(std::__cxx11::string_const&)>
            ();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"range_internal",&local_b1)
  ;
  Module::add(pMVar1,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_90);
  pMVar1 = local_18;
  local_d8 = Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::empty;
  local_d0 = 0;
  fun<bool(chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::*)()noexcept_const>
            ((chaiscript *)&local_c8,
             (offset_in_Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_to_subr
              *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"empty",&local_f9);
  Module::add(pMVar1,&local_c8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_c8);
  pMVar1 = local_18;
  local_120 = Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front;
  local_118 = 0;
  fun<void(chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::*)()>
            ((chaiscript *)&local_110,
             (offset_in_Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_to_subr
              *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"pop_front",&local_141);
  Module::add(pMVar1,&local_110,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_110);
  pMVar1 = local_18;
  local_168 = Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front;
  local_160 = 0;
  fun<char_const&(chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::*)()const>
            ((chaiscript *)&local_158,
             (offset_in_Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_to_subr
              *)&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"front",&local_189);
  Module::add(pMVar1,&local_158,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_158);
  pMVar1 = local_18;
  local_1b0 = Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back;
  local_1a8 = 0;
  fun<void(chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::*)()>
            ((chaiscript *)&local_1a0,
             (offset_in_Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_to_subr
              *)&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"pop_back",&local_1d1);
  Module::add(pMVar1,&local_1a0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1a0);
  pMVar1 = local_18;
  local_1f8 = Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back;
  local_1f0 = 0;
  fun<char_const&(chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::*)()const>
            ((chaiscript *)&local_1e8,
             (offset_in_Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_to_subr
              *)&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"back",&local_219);
  Module::add(pMVar1,&local_1e8,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e8);
  return;
}

Assistant:

void input_range_type_impl(const std::string &type, Module &m) {
      m.add(user_type<Bidir_Type>(), type + "_Range");

      copy_constructor<Bidir_Type>(type + "_Range", m);

      m.add(constructor<Bidir_Type(typename Bidir_Type::container_type &)>(), "range_internal");

      m.add(fun(&Bidir_Type::empty), "empty");
      m.add(fun(&Bidir_Type::pop_front), "pop_front");
      m.add(fun(&Bidir_Type::front), "front");
      m.add(fun(&Bidir_Type::pop_back), "pop_back");
      m.add(fun(&Bidir_Type::back), "back");
    }